

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MallocV.cpp
# Opt level: O3

BufferPos * __thiscall
adios2::format::MallocV::Allocate
          (BufferPos *__return_storage_ptr__,MallocV *this,size_t size,size_t align)

{
  pointer *ppVVar1;
  iterator __position;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  VecEntry local_40;
  
  if (size == 0) {
    sVar2 = (this->super_BufferV).CurOffset;
    __return_storage_ptr__->bufferIdx = -1;
    __return_storage_ptr__->posInBuffer = 0;
    __return_storage_ptr__->globalPos = sVar2;
    return __return_storage_ptr__;
  }
  BufferV::AlignBuffer(&this->super_BufferV,align);
  uVar3 = (this->super_BufferV).m_internalPos + size;
  uVar5 = this->m_AllocatedSize;
  if (uVar5 < uVar3) {
    auVar6._8_4_ = (int)(uVar3 >> 0x20);
    auVar6._0_8_ = uVar3;
    auVar6._12_4_ = 0x45300000;
    auVar8._8_4_ = (int)(uVar5 >> 0x20);
    auVar8._0_8_ = uVar5;
    auVar8._12_4_ = 0x45300000;
    dVar7 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * this->m_GrowthFactor;
    uVar5 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
    if (dVar7 < (auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) {
      uVar5 = uVar3;
    }
    pcVar4 = (char *)realloc(this->m_InternalBlock,uVar5);
    this->m_InternalBlock = pcVar4;
    this->m_AllocatedSize = uVar5;
  }
  __position._M_current =
       (this->super_BufferV).DataV.
       super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_BufferV).DataV.
      super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_40.Offset = (this->super_BufferV).m_internalPos;
  }
  else {
    local_40.Offset = (this->super_BufferV).m_internalPos;
    if ((__position._M_current[-1].External == false) &&
       (local_40.Offset == __position._M_current[-1].Offset + __position._M_current[-1].Size)) {
      __position._M_current[-1].Size = __position._M_current[-1].Size + size;
      goto LAB_004aaa85;
    }
  }
  local_40.External = false;
  local_40.Base = (void *)0x0;
  if (__position._M_current ==
      (this->super_BufferV).DataV.
      super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40.Size = size;
    std::
    vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>::
    _M_realloc_insert<adios2::format::BufferV::VecEntry>
              (&(this->super_BufferV).DataV,__position,&local_40);
  }
  else {
    (__position._M_current)->Offset = local_40.Offset;
    (__position._M_current)->Size = size;
    *(ulong *)__position._M_current = (ulong)(uint7)local_40._1_7_ << 8;
    (__position._M_current)->Base = (void *)0x0;
    ppVVar1 = &(this->super_BufferV).DataV.
               super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  local_40.Offset = (this->super_BufferV).m_internalPos;
LAB_004aaa85:
  sVar2 = (this->super_BufferV).CurOffset;
  __return_storage_ptr__->bufferIdx = 0;
  __return_storage_ptr__->posInBuffer = local_40.Offset;
  __return_storage_ptr__->globalPos = sVar2;
  (this->super_BufferV).CurOffset = sVar2 + size;
  (this->super_BufferV).m_internalPos = local_40.Offset + size;
  return __return_storage_ptr__;
}

Assistant:

BufferV::BufferPos MallocV::Allocate(const size_t size, size_t align)
{
    if (size == 0)
    {
        return BufferPos(-1, 0, CurOffset);
    }

    AlignBuffer(align);

    if (m_internalPos + size > m_AllocatedSize)
    {
        // need to resize
        size_t NewSize;
        if (m_internalPos + size > m_AllocatedSize * m_GrowthFactor)
        {
            // just grow as needed (more than GrowthFactor)
            NewSize = m_internalPos + size;
        }
        else
        {
            NewSize = (size_t)(m_AllocatedSize * m_GrowthFactor);
        }
        m_InternalBlock = (char *)realloc(m_InternalBlock, NewSize);
        m_AllocatedSize = NewSize;
    }

    if (DataV.size() && !DataV.back().External &&
        (m_internalPos == (DataV.back().Offset + DataV.back().Size)))
    {
        // just add to the size of the existing tail entry
        DataV.back().Size += size;
    }
    else
    {
        DataV.push_back({false, NULL, m_internalPos, size});
    }

    BufferPos bp(0, m_internalPos, CurOffset);
    // valid ptr anytime <-- m_InternalBlock + m_internalPos;

    CurOffset += size;
    m_internalPos += size;

    return bp;
}